

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parsePrimaryExpression(Parser *this)

{
  TokenType TVar1;
  undefined8 extraout_RAX;
  long in_RSI;
  Parser *this_00;
  undefined1 local_30 [32];
  
  TVar1 = Token::type((Token *)(in_RSI + 0x20));
  if (TVar1 == LEFT_PARENTHESIS) {
    parseParenthesisExpression(this);
  }
  else if (TVar1 == IDENTIFIER) {
    parseIdentifierExpression(this);
  }
  else {
    if (TVar1 != NUMBER) {
      this_00 = (Parser *)local_30;
      local_30._0_8_ = (CalculationEngine *)(local_30 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,"Expected an expression","");
      parseError(this_00,(string *)local_30);
      if ((CalculationEngine *)local_30._0_8_ != (CalculationEngine *)(local_30 + 0x10)) {
        operator_delete((void *)local_30._0_8_,(ulong)(local_30._16_8_ + 1));
      }
      _Unwind_Resume(extraout_RAX);
    }
    parseNumberExpression(this);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parsePrimaryExpression() {
	switch (mCurrentToken.type()) {
	case TokenType::NUMBER:
		return parseNumberExpression();
	case TokenType::IDENTIFIER:
		return parseIdentifierExpression();
	case TokenType::LEFT_PARENTHESIS:
		return parseParenthesisExpression();
	default:
		parseError("Expected an expression");
		return nullptr;
	}
}